

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool ckh_rebuild(ckh_t *ckh,ckhc_t *aTab)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  void **ppvVar4;
  void *data;
  void *key;
  void *local_40;
  void *local_38;
  
  uVar1 = ckh->count;
  ckh->count = 0;
  if (uVar1 != 0) {
    ppvVar4 = &aTab->data;
    uVar3 = 0;
    do {
      local_38 = ((ckhc_t *)(ppvVar4 + -1))->key;
      if (local_38 != (void *)0x0) {
        local_40 = *ppvVar4;
        _Var2 = ckh_try_insert(ckh,&local_38,&local_40);
        if (_Var2) {
          ckh->count = uVar1;
          return true;
        }
        uVar3 = uVar3 + 1;
      }
      ppvVar4 = ppvVar4 + 2;
    } while (uVar3 < uVar1);
  }
  return false;
}

Assistant:

static bool
ckh_rebuild(ckh_t *ckh, ckhc_t *aTab) {
	size_t count, i, nins;
	const void *key, *data;

	count = ckh->count;
	ckh->count = 0;
	for (i = nins = 0; nins < count; i++) {
		if (aTab[i].key != NULL) {
			key = aTab[i].key;
			data = aTab[i].data;
			if (ckh_try_insert(ckh, &key, &data)) {
				ckh->count = count;
				return true;
			}
			nins++;
		}
	}

	return false;
}